

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O3

void __thiscall OPNMIDIplay::partialReset(OPNMIDIplay *this)

{
  int emulator;
  uint uVar1;
  OPN2 *this_00;
  unsigned_long PCM_RATE;
  OPNFamily family;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar2;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 local_a0 [96];
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppStack_40;
  bool local_38;
  
  this_00 = (this->m_synth).m_p;
  panic(this);
  killSustainingNotes(this,-1,-1,3);
  uVar4 = 0;
  (this->m_setup).tick_skip_samples_delay = 0;
  this_00->m_runAtPcmRate = (this->m_setup).runAtPcmRate;
  emulator = (this->m_setup).emulator;
  PCM_RATE = (this->m_setup).PCM_RATE;
  family = OPN2::chipFamily(this_00);
  OPN2::reset(this_00,emulator,PCM_RATE,family,this);
  std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::_M_erase_at_end
            (&this->m_chipChannels,
             (this->m_chipChannels).
             super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>.
             _M_impl.super__Vector_impl_data._M_start);
  uVar1 = this_00->m_numChannels;
  local_a0._0_8_ = 0;
  local_a0._64_8_ = operator_new__(0x2800);
  local_38 = true;
  local_a0._56_8_ = 0x80;
  local_a0._48_8_ = 0;
  local_a0._88_8_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0;
  ppStack_40 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0;
  ppVar2 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)local_a0._64_8_;
  do {
    ppVar3 = ppVar2 + -1;
    if (uVar4 == 0) {
      ppVar3 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0;
    }
    (ppVar2->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).prev = ppVar3;
    bVar5 = uVar4 < 0x7f;
    uVar4 = uVar4 + 1;
    ppVar3 = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0;
    if (bVar5) {
      ppVar3 = ppVar2 + 1;
    }
    (ppVar2->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next = ppVar3;
    (ppVar2->value).loc.MidCh = 0;
    (ppVar2->value).loc.note = '\0';
    (ppVar2->value).loc._padding[0] = '\0';
    (ppVar2->value).sustained = 0;
    (ppVar2->value)._padding[0] = '\0';
    (ppVar2->value)._padding[1] = '\0';
    (ppVar2->value)._padding[2] = '\0';
    (ppVar2->value).field_0xb = 0;
    (ppVar2->value).ins.chip_chan = 0;
    (ppVar2->value).ins.ains.OPS[0].data[0] = '\0';
    (ppVar2->value).ins.ains.OPS[0].data[1] = '\0';
    *(undefined8 *)((ppVar2->value).ins.ains.OPS[0].data + 2) = 0;
    *(undefined8 *)((ppVar2->value).ins.ains.OPS[1].data + 3) = 0;
    *(undefined8 *)((ppVar2->value).ins.ains.OPS[2].data + 4) = 0;
    *(undefined8 *)((ppVar2->value).ins.ains.OPS[3].data + 5) = 0;
    (ppVar2->value).kon_time_until_neglible_us = 0;
    (ppVar2->value).vibdelay_us = 0;
    ppVar2 = ppVar2 + 1;
  } while (uVar4 != 0x80);
  local_a0[0x18] = '\0';
  local_a0[0x19] = '\0';
  local_a0[0x1a] = '\0';
  local_a0[0x1b] = '\0';
  local_a0[0x1c] = '\0';
  local_a0[0x1d] = '\0';
  local_a0[0x1e] = '\0';
  local_a0[0x1f] = '\0';
  local_a0[0x20] = '\0';
  local_a0[0x21] = '\0';
  local_a0[0x22] = '\0';
  local_a0[0x23] = '\0';
  local_a0[0x24] = '\0';
  local_a0[0x25] = '\0';
  local_a0[0x26] = '\0';
  local_a0[0x27] = '\0';
  local_a0._8_2_ = 0;
  local_a0[10] = '\0';
  local_a0[0xb] = '\0';
  local_a0[0xc] = '\0';
  local_a0[0xd] = '\0';
  local_a0[0xe] = '\0';
  local_a0[0xf] = '\0';
  local_a0[0x10] = '\0';
  local_a0[0x11] = '\0';
  local_a0[0x12] = '\0';
  local_a0[0x13] = '\0';
  local_a0[0x14] = '\0';
  local_a0[0x15] = '\0';
  local_a0[0x16] = '\0';
  local_a0[0x17] = '\0';
  local_a0._40_2_ = 0;
  local_a0._72_8_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)(local_a0 + 0x58);
  local_a0._80_8_ = local_a0._64_8_;
  std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::resize
            (&this->m_chipChannels,(ulong)uVar1,(value_type *)local_a0);
  if ((local_38 == true) &&
     ((pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)local_a0._64_8_ !=
      (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0)) {
    operator_delete__((void *)local_a0._64_8_);
  }
  resetMIDIDefaults(this,0);
  return;
}

Assistant:

void OPNMIDIplay::partialReset()
{
    Synth &synth = *m_synth;
    realTime_panic();
    m_setup.tick_skip_samples_delay = 0;
    synth.m_runAtPcmRate = m_setup.runAtPcmRate;
    synth.reset(m_setup.emulator, m_setup.PCM_RATE, synth.chipFamily(), this);
    m_chipChannels.clear();
    m_chipChannels.resize(synth.m_numChannels);
    resetMIDIDefaults();
#if defined(OPNMIDI_MIDI2VGM) && !defined(OPNMIDI_DISABLE_MIDI_SEQUENCER)
    m_sequencerInterface->onloopStart = synth.m_loopStartHook;
    m_sequencerInterface->onloopStart_userData = synth.m_loopStartHookData;
    m_sequencerInterface->onloopEnd = synth.m_loopEndHook;
    m_sequencerInterface->onloopEnd_userData = synth.m_loopEndHookData;
    m_sequencer->setLoopHooksOnly(m_sequencerInterface->onloopStart != NULL);
#endif
}